

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O2

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_-1>
::LinearizeQPTerm(LinTerms *__return_storage_ptr__,
                 QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
                 *this,double c,int x,int y)

{
  bool bVar1;
  
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     (this->
                     super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).mdl_cvt_,x);
  if ((!bVar1) &&
     (bVar1 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                        ((FlatModel<mp::DefaultFlatModelParams> *)
                         (this->
                         super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).mdl_cvt_,y), !bVar1)) {
    LinearizeGeneralProduct(__return_storage_ptr__,this,c,x,y);
    return __return_storage_ptr__;
  }
  LinearizeProductWithBinaryVar(__return_storage_ptr__,this,c,x,y);
  return __return_storage_ptr__;
}

Assistant:

LinTerms LinearizeQPTerm(double c, int x, int y) {
    if (GetMC().is_binary_var(x) ||
        GetMC().is_binary_var(y))
      return LinearizeProductWithBinaryVar(c, x, y);
    return LinearizeGeneralProduct(c, x, y);
  }